

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

string * google::protobuf::compiler::(anonymous_namespace)::CreatePluginArg_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  LogMessage *pLVar3;
  AlphaNum *in_RCX;
  string *in_RDI;
  AlphaNum local_b8;
  AlphaNum local_88;
  undefined4 local_58;
  allocator<char> local_52 [2];
  LogMessage local_50;
  Voidify local_3d [13];
  undefined1 local_30 [8];
  string plugin_path;
  
  std::__cxx11::string::string((string *)local_30);
  std::__cxx11::string::operator=
            ((string *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/test_plugin"
            );
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = File::Exists((string *)local_30), bVar1)) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_88,"--plugin=prefix-gen-plug=");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    absl::lts_20250127::StrCat_abi_cxx11_(in_RDI,(lts_20250127 *)&local_88,&local_b8,in_RCX);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x7f);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [64])
                               "Plugin executable not found.  Plugin tests are likely to fail. ");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(string *)local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_3d,pLVar3);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,anon_var_dwarf_37cdd0 + 5,local_52);
    std::allocator<char>::~allocator(local_52);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

std::string CreatePluginArg() {
  std::string plugin_path;
#ifdef GOOGLE_PROTOBUF_TEST_PLUGIN_PATH
  plugin_path = GOOGLE_PROTOBUF_TEST_PLUGIN_PATH;
#else
  const char* possible_paths[] = {
      // When building with shared libraries, libtool hides the real
      // executable
      // in .libs and puts a fake wrapper in the current directory.
      // Unfortunately, due to an apparent bug on Cygwin/MinGW, if one program
      // wrapped in this way (e.g. protobuf-tests.exe) tries to execute
      // another
      // program wrapped in this way (e.g. test_plugin.exe), the latter fails
      // with error code 127 and no explanation message.  Presumably the
      // problem
      // is that the wrapper for protobuf-tests.exe set some environment
      // variables that confuse the wrapper for test_plugin.exe.  Luckily, it
      // turns out that if we simply invoke the wrapped test_plugin.exe
      // directly, it works -- I guess the environment variables set by the
      // protobuf-tests.exe wrapper happen to be correct for it too.  So we do
      // that.
      ".libs/test_plugin.exe",  // Win32 w/autotool (Cygwin / MinGW)
      "test_plugin.exe",        // Other Win32 (MSVC)
      "test_plugin",            // Unix
  };
  for (int i = 0; i < ABSL_ARRAYSIZE(possible_paths); ++i) {
    if (access(possible_paths[i], F_OK) == 0) {
      plugin_path = possible_paths[i];
      break;
    }
  }
#endif

  if (plugin_path.empty() || !File::Exists(plugin_path)) {
    ABSL_LOG(ERROR)
        << "Plugin executable not found.  Plugin tests are likely to fail. "
        << plugin_path;
    return "";
  }
  return absl::StrCat("--plugin=prefix-gen-plug=", plugin_path);
}